

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onepass.cc
# Opt level: O0

bool duckdb_re2::AddQ(Instq *q,int id)

{
  bool bVar1;
  int in_ESI;
  SparseSetT<void> *in_RDI;
  undefined1 local_1;
  
  if (in_ESI == 0) {
    local_1 = true;
  }
  else {
    bVar1 = SparseSetT<void>::contains(q,id);
    if (bVar1) {
      local_1 = false;
    }
    else {
      SparseSetT<void>::insert(in_RDI,in_ESI);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

static bool AddQ(Instq *q, int id) {
  if (id == 0)
    return true;
  if (q->contains(id))
    return false;
  q->insert(id);
  return true;
}